

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

ns_connection * ns_bind(ns_mgr *srv,char *str,ns_callback_t callback,void *user_data)

{
  int __fd;
  int iVar1;
  uint uVar2;
  ns_connection *pnVar3;
  int proto;
  socklen_t sa_len;
  socket_address sa;
  int use_ssl;
  char cert [100];
  char ca_cert [100];
  int local_128 [3];
  socket_address local_11c;
  int local_10c;
  char local_108 [112];
  char local_98 [112];
  
  ns_parse_address(str,&local_11c,local_128,&local_10c,local_108,local_98);
  if ((local_10c == 0) || (local_108[0] != '\0')) {
    local_128[2] = 0x10;
    local_128[1] = 1;
    __fd = socket((uint)local_11c.sa.sa_family,local_128[0],0);
    if (__fd != -1) {
      iVar1 = setsockopt(__fd,1,2,local_128 + 1,4);
      if (((iVar1 == 0) && (iVar1 = bind(__fd,(sockaddr *)&local_11c.sa,0x10), iVar1 == 0)) &&
         ((local_128[0] == 2 || (iVar1 = listen(__fd,0x1000), iVar1 == 0)))) {
        uVar2 = fcntl64(__fd,3,0);
        fcntl64(__fd,4,uVar2 | 0x800);
        getsockname(__fd,(sockaddr *)&local_11c.sa,(socklen_t *)(local_128 + 2));
        pnVar3 = ns_add_sock(srv,__fd,callback,(void *)0x0);
        if (pnVar3 != (ns_connection *)0x0) {
          uVar2 = pnVar3->flags;
          *(ulong *)&pnVar3->sa = CONCAT62(local_11c._2_6_,local_11c.sa.sa_family);
          *(uchar (*) [8])((long)&pnVar3->sa + 8) = local_11c.sin.sin_zero;
          pnVar3->flags = uVar2 | 0x80;
          pnVar3->user_data = user_data;
          pnVar3->callback = callback;
          if (local_128[0] != 2) {
            return pnVar3;
          }
          pnVar3->flags = uVar2 | 0x180;
          return pnVar3;
        }
      }
      close(__fd);
    }
  }
  return (ns_connection *)0x0;
}

Assistant:

struct ns_connection *ns_bind(struct ns_mgr *srv, const char *str,
                              ns_callback_t callback, void *user_data) {
  union socket_address sa;
  struct ns_connection *nc = NULL;
  int use_ssl, proto;
  char cert[100], ca_cert[100];
  sock_t sock;

  ns_parse_address(str, &sa, &proto, &use_ssl, cert, ca_cert);
  if (use_ssl && cert[0] == '\0') return NULL;

  if ((sock = ns_open_listening_socket(&sa, proto)) == INVALID_SOCKET) {
  } else if ((nc = ns_add_sock(srv, sock, callback, NULL)) == NULL) {
    closesocket(sock);
  } else {
    nc->sa = sa;
    nc->flags |= NSF_LISTENING;
    nc->user_data = user_data;
    nc->callback = callback;

    if (proto == SOCK_DGRAM) {
      nc->flags |= NSF_UDP;
    }

#ifdef NS_ENABLE_SSL
    if (use_ssl) {
      nc->ssl_ctx = SSL_CTX_new(SSLv23_server_method());
      if (ns_use_cert(nc->ssl_ctx, cert) != 0 ||
          ns_use_ca_cert(nc->ssl_ctx, ca_cert) != 0) {
        ns_close_conn(nc);
        nc = NULL;
      }
    }
#endif

    DBG(("%p sock %d/%d ssl %p %p", nc, sock, proto, nc->ssl_ctx, nc->ssl));
  }

  return nc;
}